

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccm.c
# Opt level: O1

int mbedtls_ccm_auth_decrypt
              (mbedtls_ccm_context *ctx,size_t length,uchar *iv,size_t iv_len,uchar *add,
              size_t add_len,uchar *input,uchar *output,uchar *tag,size_t tag_len)

{
  int iVar1;
  ulong uVar2;
  byte bVar3;
  byte abStack_28 [16];
  
  if (tag_len == 0) {
    return -0xd;
  }
  iVar1 = ccm_auth_crypt(ctx,1,length,iv,iv_len,add,add_len,input,output,abStack_28,tag_len);
  if (iVar1 == 0) {
    if (tag_len != 0) {
      uVar2 = 0;
      bVar3 = 0;
      do {
        bVar3 = bVar3 | abStack_28[uVar2] ^ tag[uVar2];
        uVar2 = uVar2 + 1;
      } while ((uVar2 & 0xff) < tag_len);
      if (bVar3 != 0) {
        mbedtls_platform_zeroize(output,length);
        return -0xf;
      }
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int mbedtls_ccm_auth_decrypt( mbedtls_ccm_context *ctx, size_t length,
                      const unsigned char *iv, size_t iv_len,
                      const unsigned char *add, size_t add_len,
                      const unsigned char *input, unsigned char *output,
                      const unsigned char *tag, size_t tag_len )
{
    CCM_VALIDATE_RET( ctx != NULL );
    CCM_VALIDATE_RET( iv != NULL );
    CCM_VALIDATE_RET( add_len == 0 || add != NULL );
    CCM_VALIDATE_RET( length == 0 || input != NULL );
    CCM_VALIDATE_RET( length == 0 || output != NULL );
    CCM_VALIDATE_RET( tag_len == 0 || tag != NULL );

    if( tag_len == 0 )
        return( MBEDTLS_ERR_CCM_BAD_INPUT );

    return( mbedtls_ccm_star_auth_decrypt( ctx, length, iv, iv_len, add,
                add_len, input, output, tag, tag_len ) );
}